

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<google::protobuf::internal::LazyString>
          (ArenaStringPtr *this,Arena *arena,LazyString *lazy_default)

{
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __pointer_type args;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((this->tagged_ptr_).ptr_ != (void *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0x9b);
    other = LogMessage::operator<<(&local_58,"CHECK failed: IsDefault(default_value): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  args = (lazy_default->inited_)._M_b._M_p;
  if (args == (__pointer_type)0x0) {
    args = LazyString::Init_abi_cxx11_(lazy_default);
  }
  pbVar1 = Arena::Create<std::__cxx11::string,std::__cxx11::string_const&>(arena,args);
  (this->tagged_ptr_).ptr_ = pbVar1;
  return pbVar1;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}